

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseResolver<std::shared_ptr<int>_>::
reject<std::__exception_ptr::exception_ptr>
          (PromiseResolver<std::shared_ptr<int>_> *this,exception_ptr *error)

{
  QPromise<std::shared_ptr<int>_> *pQVar1;
  Data *pDVar2;
  PromiseData<std::shared_ptr<int>_> *pPVar3;
  QPromise<std::shared_ptr<int>_> *promise;
  exception_ptr *error_local;
  PromiseResolver<std::shared_ptr<int>_> *this_local;
  
  pDVar2 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::shared_ptr<int>_>::Data>
           ::operator->(&this->m_d);
  pQVar1 = pDVar2->promise;
  if (pQVar1 != (QPromise<std::shared_ptr<int>_> *)0x0) {
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<std::shared_ptr<int>_>_>::
             operator->(&(pQVar1->super_QPromiseBase<std::shared_ptr<int>_>).m_d);
    PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>::
    reject<std::__exception_ptr::exception_ptr>
              (&pPVar3->
                super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>,
               error);
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<std::shared_ptr<int>_>_>::
             operator->(&(pQVar1->super_QPromiseBase<std::shared_ptr<int>_>).m_d);
    PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>::dispatch
              (&pPVar3->
                super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>);
    release(this);
  }
  return;
}

Assistant:

void reject(E&& error)
    {
        auto promise = m_d->promise;
        if (promise) {
            Q_ASSERT(promise->isPending());
            promise->m_d->reject(std::forward<E>(error));
            promise->m_d->dispatch();
            release();
        }
    }